

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O1

void dump_mmt_buf_as_words_desc(mmt_buf *buf,_func_char_ptr_uint32_t *fun)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (3 < buf->len) {
    uVar3 = 0;
    do {
      if (fun == (_func_char_ptr_uint32_t *)0x0) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = (*fun)(buf[uVar3 + 1].len);
      }
      uVar2 = (ulong)buf[uVar3 + 1].len;
      if (pcVar1 == (char *)0x0) {
        if (indent_logs == 0) {
          fprintf(_stdout,"LOG:         0x%08x\n",uVar2);
        }
        else {
          fprintf(_stdout,"%64s        0x%08x\n"," ");
        }
      }
      else if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x   [%s]\n",uVar2,pcVar1);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x   [%s]\n"," ",uVar2,pcVar1);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < buf->len >> 2);
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words_desc(struct mmt_buf *buf, const char *(*fun)(uint32_t))
{
	int j;
	uint32_t *data = (uint32_t *)buf->data;
	for (j = 0; j < buf->len / 4; ++j)
	{
		const char *tmp = NULL;
		if (fun)
			tmp = fun(data[j]);

		if (tmp)
			mmt_log("        0x%08x   [%s]\n", data[j], tmp);
		else
			mmt_log("        0x%08x\n", data[j]);
	}
}